

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal-multiple-loops.c
# Opt level: O2

void signal2_cb(uv_signal_t *handle,int signum)

{
  if (signum == 0xc) {
    increment_counter(&signal2_cb_counter);
    uv_signal_stop(handle);
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal-multiple-loops.c"
          ,0x4c,"signum == SIGUSR2");
  abort();
}

Assistant:

static void signal2_cb(uv_signal_t* handle, int signum) {
  ASSERT(signum == SIGUSR2);
  increment_counter(&signal2_cb_counter);
  uv_signal_stop(handle);
}